

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_nested_loop_join.cpp
# Opt level: O1

void __thiscall
duckdb::PhysicalNestedLoopJoin::ResolveSimpleJoin
          (PhysicalNestedLoopJoin *this,ExecutionContext *context,DataChunk *input,DataChunk *chunk,
          OperatorState *state_p)

{
  DataChunk *this_00;
  char cVar1;
  pointer pGVar2;
  NotImplementedException *this_01;
  bool found_match [2048];
  string local_858;
  bool local_838 [2056];
  
  pGVar2 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                       super_CachingPhysicalOperator.super_PhysicalOperator.sink_state);
  this_00 = (DataChunk *)(state_p + 3);
  DataChunk::Reset(this_00);
  ExpressionExecutor::Execute((ExpressionExecutor *)(state_p + 0xb),input,this_00);
  switchD_0105b559::default(local_838,0,0x800);
  NestedLoopJoinMark::Perform
            (this_00,(ColumnDataCollection *)
                     &pGVar2[2].super_StateWithBlockableTasks.blocked_tasks.
                      super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
                      super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                      ._M_impl.super__Vector_impl_data._M_finish,local_838,
             &(this->super_PhysicalComparisonJoin).conditions);
  cVar1 = (this->super_PhysicalComparisonJoin).super_PhysicalJoin.super_CachingPhysicalOperator.
          field_0x81;
  if (cVar1 == '\x05') {
    PhysicalJoin::ConstructSemiJoinResult(input,chunk,local_838);
  }
  else if (cVar1 == '\x06') {
    PhysicalJoin::ConstructAntiJoinResult(input,chunk,local_838);
  }
  else {
    if (cVar1 != '\a') {
      this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_858,"Unimplemented type for simple nested loop join!","");
      NotImplementedException::NotImplementedException(this_01,&local_858);
      __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    PhysicalJoin::ConstructMarkJoinResult
              (this_00,input,chunk,local_838,(bool)(*(byte *)&pGVar2[4]._vptr_GlobalSinkState & 1));
  }
  return;
}

Assistant:

void PhysicalNestedLoopJoin::ResolveSimpleJoin(ExecutionContext &context, DataChunk &input, DataChunk &chunk,
                                               OperatorState &state_p) const {
	auto &state = state_p.Cast<PhysicalNestedLoopJoinState>();
	auto &gstate = sink_state->Cast<NestedLoopJoinGlobalState>();

	// resolve the left join condition for the current chunk
	state.left_condition.Reset();
	state.lhs_executor.Execute(input, state.left_condition);

	bool found_match[STANDARD_VECTOR_SIZE] = {false};
	NestedLoopJoinMark::Perform(state.left_condition, gstate.right_condition_data, found_match, conditions);
	switch (join_type) {
	case JoinType::MARK:
		// now construct the mark join result from the found matches
		PhysicalJoin::ConstructMarkJoinResult(state.left_condition, input, chunk, found_match, gstate.has_null);
		break;
	case JoinType::SEMI:
		// construct the semi join result from the found matches
		PhysicalJoin::ConstructSemiJoinResult(input, chunk, found_match);
		break;
	case JoinType::ANTI:
		// construct the anti join result from the found matches
		PhysicalJoin::ConstructAntiJoinResult(input, chunk, found_match);
		break;
	default:
		throw NotImplementedException("Unimplemented type for simple nested loop join!");
	}
}